

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O1

EbmlElement * __thiscall libebml::EbmlMaster::FindNextElt(EbmlMaster *this,EbmlElement *PastElt)

{
  int iVar1;
  pointer ppEVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  ppEVar2 = (this->ElementList).
            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->ElementList).
                super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar2;
  if (lVar4 == 0) {
    uVar7 = 0;
  }
  else {
    lVar4 = lVar4 >> 3;
    uVar5 = lVar4 + (ulong)(lVar4 == 0);
    uVar6 = 1;
    do {
      uVar7 = uVar6;
      if (ppEVar2[uVar6 - 1] == PastElt) break;
      bVar8 = uVar6 != uVar5;
      uVar7 = uVar5;
      uVar6 = uVar6 + 1;
    } while (bVar8);
  }
  lVar4 = (long)(this->ElementList).
                super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->ElementList).
                super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if ((ulong)(lVar4 >> 3) <= uVar7) {
      return (EbmlElement *)0x0;
    }
    iVar3 = (*PastElt->_vptr_EbmlElement[3])(PastElt);
    iVar1 = *(int *)CONCAT44(extraout_var,iVar3);
    lVar4 = *(long *)((int *)CONCAT44(extraout_var,iVar3) + 2);
    iVar3 = (*(this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar7]->_vptr_EbmlElement[3])();
    if ((*(long *)((int *)CONCAT44(extraout_var_00,iVar3) + 2) == lVar4) &&
       (*(int *)CONCAT44(extraout_var_00,iVar3) == iVar1)) break;
    uVar7 = uVar7 + 1;
    lVar4 = (long)(this->ElementList).
                  super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->ElementList).
                  super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  }
  return (this->ElementList).
         super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>._M_impl
         .super__Vector_impl_data._M_start[uVar7];
}

Assistant:

EbmlElement *EbmlMaster::FindNextElt(const EbmlElement & PastElt) const
{
  size_t Index;

  for (Index = 0; Index < ElementList.size(); Index++) {
    if ((ElementList[Index]) == &PastElt) {
      // found past element, new one is :
      Index++;
      break;
    }
  }

  while (Index < ElementList.size()) {
    if ((EbmlId)PastElt == (EbmlId)(*ElementList[Index]))
      return ElementList[Index];
    Index++;
  }

  return NULL;
}